

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMacros.cpp
# Opt level: O0

void test_HEXDUMP(void)

{
  ostream *poVar1;
  int *data;
  size_type sVar2;
  double local_60;
  double local_58;
  double local_50;
  int *local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  allocator<int> local_21;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> foo;
  
  std::allocator<int>::allocator(&local_21);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,0x20,&local_21);
  std::allocator<int>::~allocator(&local_21);
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  local_48 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_20);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (local_40,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_48,1)
  ;
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/TestMacros/TestMacros.cpp:27: "
                          );
  poVar1 = std::operator<<(poVar1,"void test_HEXDUMP()");
  std::operator<<(poVar1,":\nfoo:\n");
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  JEBDebug::hexdump<std::vector<int,_std::allocator<int>_>,_0>
            (poVar1,(vector<int,_std::allocator<int>_> *)local_20);
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/TestMacros/TestMacros.cpp:28: "
                          );
  poVar1 = std::operator<<(poVar1,"void test_HEXDUMP()");
  std::operator<<(poVar1,":\nfoo.data(), foo.size() * sizeof(int):\n");
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  data = std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)local_20)
  ;
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_20);
  JEBDebug::hexdump(poVar1,data,sVar2 << 2,0x10);
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/TestMacros/TestMacros.cpp:29: "
                          );
  poVar1 = std::operator<<(poVar1,"void test_HEXDUMP()");
  std::operator<<(poVar1,":\n-1.0:\n");
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  local_50 = -1.0;
  JEBDebug::hexdump<double,_0>(poVar1,&local_50);
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/TestMacros/TestMacros.cpp:30: "
                          );
  poVar1 = std::operator<<(poVar1,"void test_HEXDUMP()");
  std::operator<<(poVar1,":\n0.0:\n");
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  local_58 = 0.0;
  JEBDebug::hexdump<double,_0>(poVar1,&local_58);
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/TestMacros/TestMacros.cpp:31: "
                          );
  poVar1 = std::operator<<(poVar1,"void test_HEXDUMP()");
  std::operator<<(poVar1,":\n1.0:\n");
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  local_60 = 1.0;
  JEBDebug::hexdump<double,_0>(poVar1,&local_60);
  poVar1 = JEBDebug::Stream::operator()((Stream *)&JEBDebug::STREAM);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

void test_HEXDUMP()
{
    std::vector<int> foo(32);
    std::iota(foo.begin(), foo.end(), 1);
    JEB_HEXDUMP(foo);
    JEB_HEXDUMP(foo.data(), foo.size() * sizeof(int));
    JEB_HEXDUMP(-1.0);
    JEB_HEXDUMP(0.0);
    JEB_HEXDUMP(1.0);
}